

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall httplib::detail::SocketStream::is_writable(SocketStream *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  fd_set fds;
  timeval local_b8;
  fd_set local_a8;
  
  iVar1 = this->sock_;
  bVar2 = true;
  if (iVar1 < 0x400) {
    local_a8.fds_bits[0xe] = 0;
    local_a8.fds_bits[0xf] = 0;
    local_a8.fds_bits[0xc] = 0;
    local_a8.fds_bits[0xd] = 0;
    local_a8.fds_bits[10] = 0;
    local_a8.fds_bits[0xb] = 0;
    local_a8.fds_bits[8] = 0;
    local_a8.fds_bits[9] = 0;
    local_a8.fds_bits[6] = 0;
    local_a8.fds_bits[7] = 0;
    local_a8.fds_bits[4] = 0;
    local_a8.fds_bits[5] = 0;
    local_a8.fds_bits[2] = 0;
    local_a8.fds_bits[3] = 0;
    local_a8.fds_bits[0] = 0;
    local_a8.fds_bits[1] = 0;
    iVar3 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar3 = iVar1;
    }
    local_a8.fds_bits[iVar3 >> 6] =
         local_a8.fds_bits[iVar3 >> 6] | 1L << ((byte)(iVar1 % 0x40) & 0x3f);
    local_b8.tv_sec = this->write_timeout_sec_;
    local_b8.tv_usec = this->write_timeout_usec_;
    do {
      iVar3 = select(iVar1 + 1,(fd_set *)0x0,&local_a8,(fd_set *)0x0,&local_b8);
      if (-1 < iVar3) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    bVar2 = 0 < iVar3;
  }
  return bVar2;
}

Assistant:

inline bool SocketStream::is_writable() const {
            return select_write(sock_, write_timeout_sec_, write_timeout_usec_) > 0;
        }